

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rk_function.hpp
# Opt level: O0

vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
* __thiscall
cvs_rk::rk_function<9223372036854775783UL>::to_mod_vector
          (rk_function<9223372036854775783UL> *this,string *S)

{
  size_type __n;
  bool bVar1;
  reference pcVar2;
  reference pvVar3;
  undefined8 in_RDX;
  mod_int<9223372036854775783UL> in_RSI;
  allocator_type *in_RDI;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  ulint i;
  mod_int_t coefficient;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff38;
  mod_int<9223372036854775783UL> in_stack_ffffffffffffff40;
  allocator_type *this_00;
  mod_int<9223372036854775783UL> local_70;
  ulint local_68;
  char local_59;
  undefined8 local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_48;
  size_type local_40;
  undefined1 local_21;
  mod_int<9223372036854775783UL> local_20;
  undefined8 local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  mod_int<9223372036854775783UL>::mod_int(&local_20,1);
  local_21 = 0;
  std::__cxx11::string::length();
  std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>::allocator
            ((allocator<cvs_rk::mod_int<9223372036854775783UL>_> *)0x1221e7);
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            *)this_00,in_RSI.val,in_RDI);
  std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>::~allocator
            ((allocator<cvs_rk::mod_int<9223372036854775783UL>_> *)0x12220a);
  local_40 = 0;
  local_48 = local_18;
  local_50._M_current = (char *)std::__cxx11::string::begin();
  local_58 = std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffff40.val,in_stack_ffffffffffffff38), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_50);
    local_59 = *pcVar2;
    mod_int<9223372036854775783UL>::mod_int(&local_70,(long)local_59);
    local_68 = (ulint)mod_int<9223372036854775783UL>::operator*
                                ((mod_int<9223372036854775783UL> *)in_RDI,in_RSI);
    __n = local_40;
    local_40 = local_40 + 1;
    pvVar3 = std::
             vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
             ::operator[]((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                           *)this_00,__n);
    pvVar3->val = local_68;
    in_stack_ffffffffffffff40 =
         mod_int<9223372036854775783UL>::operator*((mod_int<9223372036854775783UL> *)in_RDI,in_RSI);
    local_20 = in_stack_ffffffffffffff40;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_50);
  }
  return (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
          *)in_RDI;
}

Assistant:

vector<mod_int_t> to_mod_vector(string& S){

		mod_int_t coefficient = 1;

		auto result = vector<mod_int_t>(S.length());
		ulint i = 0;

		for(auto c : S){

			result[i++] = mod_int_t(c) * coefficient;
			coefficient = coefficient * sigma;

		}

		return result;

	}